

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int HistogramCombineStochastic(VP8LHistogramSet *image_histo,int min_cluster_size,int *do_greedy)

{
  int iVar1;
  int good_id;
  int i;
  VP8LHistogram **ppVVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint *in_RDX;
  int in_ESI;
  VP8LHistogramSet *in_RDI;
  int is_idx2_best;
  int is_idx1_best;
  HistogramPair *p;
  uint32_t idx2;
  uint32_t idx1;
  uint32_t tmp;
  int64_t curr_cost;
  int num_tries;
  uint32_t rand_range;
  int best_idx2;
  int best_idx1;
  int64_t best_cost;
  int ok;
  int kHistoQueueSize;
  HistoQueue histo_queue;
  VP8LHistogram **histograms;
  int num_tries_no_success;
  int outer_iters;
  int tries_with_no_success;
  uint32_t seed;
  int iter;
  int j;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined5 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 uVar11;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar12;
  VP8LHistogram *cost_threshold;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar13;
  VP8LHistogram *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  VP8LHistogram *in_stack_ffffffffffffff88;
  VP8LHistogram *threshold;
  int idx2_00;
  int idx1_00;
  VP8LHistogram **in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_30;
  uint32_t local_2c;
  int local_28;
  int local_24;
  uint *local_20;
  int local_14;
  VP8LHistogramSet *local_10;
  int local_4;
  
  local_2c = 1;
  local_30 = 0;
  iVar1 = in_RDI->size;
  ppVVar2 = in_RDI->histograms;
  idx1_00 = 9;
  idx2_00 = 0;
  if (in_RDI->size < in_ESI) {
    *in_RDX = 1;
    local_4 = 1;
  }
  else {
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    iVar4 = HistoQueueInit((HistoQueue *)
                           CONCAT17(in_stack_ffffffffffffff57,
                                    CONCAT16(in_stack_ffffffffffffff56,
                                             CONCAT15(in_stack_ffffffffffffff55,
                                                      in_stack_ffffffffffffff50))),
                           in_stack_ffffffffffffff4c);
    if (iVar4 != 0) {
      local_28 = 0;
      while( true ) {
        uVar13 = false;
        if ((local_28 < iVar1) && (uVar13 = false, local_14 <= local_10->size)) {
          local_30 = local_30 + 1;
          uVar13 = local_30 < iVar1 / 2;
        }
        if ((bool)uVar13 == false) break;
        if (in_stack_ffffffffffffffb8 == 0) {
          cost_threshold = (VP8LHistogram *)0x0;
        }
        else {
          cost_threshold = in_stack_ffffffffffffffb0[1];
        }
        uVar5 = (local_10->size + -1) * local_10->size;
        iVar4 = local_10->size / 2;
        threshold = cost_threshold;
        for (local_24 = 0; bVar3 = 1 < local_10->size, uVar12 = bVar3 && local_24 < iVar4,
            bVar3 && local_24 < iVar4; local_24 = local_24 + 1) {
          uVar6 = MyRand(&local_2c);
          in_stack_ffffffffffffff84 = uVar6 % uVar5;
          in_stack_ffffffffffffff80 = in_stack_ffffffffffffff84 / (local_10->size - 1U);
          in_stack_ffffffffffffff7c = in_stack_ffffffffffffff84 % (local_10->size - 1U);
          if (in_stack_ffffffffffffff80 <= in_stack_ffffffffffffff7c) {
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1;
          }
          in_stack_ffffffffffffff88 =
               (VP8LHistogram *)
               HistoQueuePush((HistoQueue *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              in_stack_ffffffffffffffb0,idx1_00,idx2_00,(int64_t)threshold);
          if (((long)in_stack_ffffffffffffff88 < 0) &&
             (threshold = in_stack_ffffffffffffff88,
             in_stack_ffffffffffffffb8 == in_stack_ffffffffffffffbc)) break;
        }
        if (in_stack_ffffffffffffffb8 != 0) {
          good_id = *(int *)in_stack_ffffffffffffffb0;
          i = *(int *)((long)in_stack_ffffffffffffffb0 + 4);
          HistogramAdd((VP8LHistogram *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (VP8LHistogram *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       in_stack_ffffffffffffff70);
          UpdateHistogramCost((uint64_t)in_stack_ffffffffffffffb0[2],
                              (uint64_t *)(in_stack_ffffffffffffffb0 + 3),ppVVar2[good_id]);
          HistogramSetRemoveHistogram(local_10,i);
          local_24 = 0;
          while (local_24 < in_stack_ffffffffffffffb8) {
            in_stack_ffffffffffffff70 =
                 (VP8LHistogram *)(in_stack_ffffffffffffffb0 + (long)local_24 * 8);
            uVar11 = true;
            if (*(int *)&in_stack_ffffffffffffff70->literal != good_id) {
              uVar11 = *(int *)&in_stack_ffffffffffffff70->literal == i;
            }
            uVar7 = (uint)(byte)uVar11;
            uVar10 = true;
            if (*(int *)((long)&in_stack_ffffffffffffff70->literal + 4) != good_id) {
              uVar10 = *(int *)((long)&in_stack_ffffffffffffff70->literal + 4) == i;
            }
            uVar8 = (uint)(byte)uVar10;
            if ((uVar7 == 0) || (uVar8 == 0)) {
              if ((uVar7 == 0) && (uVar8 == 0)) {
LAB_00193f2b:
                HistoQueueFixPair(local_10->size,i,(HistogramPair *)in_stack_ffffffffffffff70);
                HistoQueueUpdateHead
                          ((HistoQueue *)CONCAT44(uVar5,iVar4),
                           (HistogramPair *)in_stack_ffffffffffffff88);
                local_24 = local_24 + 1;
              }
              else {
                HistoQueueFixPair(i,good_id,(HistogramPair *)in_stack_ffffffffffffff70);
                iVar9 = HistoQueueUpdatePair
                                  ((VP8LHistogram *)CONCAT44(uVar7,uVar8),
                                   (VP8LHistogram *)CONCAT17(uVar13,in_stack_ffffffffffffff60),
                                   (int64_t)cost_threshold,
                                   (HistogramPair *)
                                   CONCAT17(uVar12,CONCAT16(uVar11,CONCAT15(uVar10,
                                                  in_stack_ffffffffffffff50))));
                if (iVar9 != 0) goto LAB_00193f2b;
                HistoQueuePopPair((HistoQueue *)
                                  CONCAT17(uVar12,CONCAT16(uVar11,CONCAT15(uVar10,
                                                  in_stack_ffffffffffffff50))),
                                  (HistogramPair *)
                                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
              }
            }
            else {
              HistoQueuePopPair((HistoQueue *)
                                CONCAT17(uVar12,CONCAT16(uVar11,CONCAT15(uVar10,
                                                  in_stack_ffffffffffffff50))),
                                (HistogramPair *)
                                CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            }
          }
          local_30 = 0;
        }
        local_28 = local_28 + 1;
      }
      *local_20 = (uint)(local_10->size <= local_14);
      idx2_00 = 1;
    }
    HistoQueueClear((HistoQueue *)0x193fbe);
    local_4 = idx2_00;
  }
  return local_4;
}

Assistant:

static int HistogramCombineStochastic(VP8LHistogramSet* const image_histo,
                                      int min_cluster_size,
                                      int* const do_greedy) {
  int j, iter;
  uint32_t seed = 1;
  int tries_with_no_success = 0;
  const int outer_iters = image_histo->size;
  const int num_tries_no_success = outer_iters / 2;
  VP8LHistogram** const histograms = image_histo->histograms;
  // Priority queue of histogram pairs. Its size of 'kHistoQueueSize'
  // impacts the quality of the compression and the speed: the smaller the
  // faster but the worse for the compression.
  HistoQueue histo_queue;
  const int kHistoQueueSize = 9;
  int ok = 0;

  if (image_histo->size < min_cluster_size) {
    *do_greedy = 1;
    return 1;
  }

  if (!HistoQueueInit(&histo_queue, kHistoQueueSize)) goto End;

  // Collapse similar histograms in 'image_histo'.
  for (iter = 0; iter < outer_iters && image_histo->size >= min_cluster_size &&
                ++tries_with_no_success < num_tries_no_success;
      ++iter) {
    int64_t best_cost =
        (histo_queue.size == 0) ? 0 : histo_queue.queue[0].cost_diff;
    int best_idx1 = -1, best_idx2 = 1;
    const uint32_t rand_range = (image_histo->size - 1) * (image_histo->size);
    // (image_histo->size) / 2 was chosen empirically. Less means faster but
    // worse compression.
    const int num_tries = (image_histo->size) / 2;

    // Pick random samples.
    for (j = 0; image_histo->size >= 2 && j < num_tries; ++j) {
      int64_t curr_cost;
      // Choose two different histograms at random and try to combine them.
      const uint32_t tmp = MyRand(&seed) % rand_range;
      uint32_t idx1 = tmp / (image_histo->size - 1);
      uint32_t idx2 = tmp % (image_histo->size - 1);
      if (idx2 >= idx1) ++idx2;

      // Calculate cost reduction on combination.
      curr_cost =
          HistoQueuePush(&histo_queue, histograms, idx1, idx2, best_cost);
      if (curr_cost < 0) {  // found a better pair?
        best_cost = curr_cost;
        // Empty the queue if we reached full capacity.
        if (histo_queue.size == histo_queue.max_size) break;
      }
    }
    if (histo_queue.size == 0) continue;

    // Get the best histograms.
    best_idx1 = histo_queue.queue[0].idx1;
    best_idx2 = histo_queue.queue[0].idx2;
    assert(best_idx1 < best_idx2);
    // Merge the histograms and remove best_idx2 from the queue.
    HistogramAdd(histograms[best_idx2], histograms[best_idx1],
                 histograms[best_idx1]);
    UpdateHistogramCost(histo_queue.queue[0].cost_combo,
                        histo_queue.queue[0].costs, histograms[best_idx1]);
    HistogramSetRemoveHistogram(image_histo, best_idx2);
    // Parse the queue and update each pair that deals with best_idx1,
    // best_idx2 or image_histo_size.
    for (j = 0; j < histo_queue.size;) {
      HistogramPair* const p = histo_queue.queue + j;
      const int is_idx1_best = p->idx1 == best_idx1 || p->idx1 == best_idx2;
      const int is_idx2_best = p->idx2 == best_idx1 || p->idx2 == best_idx2;
      // The front pair could have been duplicated by a random pick so
      // check for it all the time nevertheless.
      if (is_idx1_best && is_idx2_best) {
        HistoQueuePopPair(&histo_queue, p);
        continue;
      }
      // Any pair containing one of the two best indices should only refer to
      // best_idx1. Its cost should also be updated.
      if (is_idx1_best || is_idx2_best) {
        HistoQueueFixPair(best_idx2, best_idx1, p);
        // Re-evaluate the cost of an updated pair.
        if (!HistoQueueUpdatePair(histograms[p->idx1], histograms[p->idx2], 0,
                                  p)) {
          HistoQueuePopPair(&histo_queue, p);
          continue;
        }
      }
      HistoQueueFixPair(image_histo->size, best_idx2, p);
      HistoQueueUpdateHead(&histo_queue, p);
      ++j;
    }
    tries_with_no_success = 0;
  }
  *do_greedy = (image_histo->size <= min_cluster_size);
  ok = 1;

 End:
  HistoQueueClear(&histo_queue);
  return ok;
}